

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_custom.cpp
# Opt level: O0

bool ImGui::DragDoubleRange2
               (char *label,double *v_current_min,double *v_current_max,float v_speed,double v_min,
               double v_max,char *format,char *format_max,float power)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  bool bVar3;
  ImGuiWindow *pIVar4;
  char *text_end;
  float w_full;
  double v_min_00;
  char *local_c8;
  double local_b8;
  double local_90;
  double local_80;
  bool value_changed;
  ImGuiContext *g;
  ImGuiWindow *window;
  float power_local;
  char *format_max_local;
  char *format_local;
  double v_max_local;
  double v_min_local;
  float v_speed_local;
  double *v_current_max_local;
  double *v_current_min_local;
  char *label_local;
  
  pIVar4 = GetCurrentWindow();
  pIVar1 = GImGui;
  if ((pIVar4->SkipItems & 1U) == 0) {
    PushID(label);
    BeginGroup();
    w_full = CalcItemWidth();
    PushMultiItemsWidths(2,w_full);
    if (v_min < v_max) {
      local_90 = ImMin<double>(v_max,*v_current_max);
      local_80 = v_min;
    }
    else {
      local_80 = -3.4028234663852886e+38;
      local_90 = *v_current_max;
    }
    bVar2 = DragDouble("##min",v_current_min,v_speed,local_80,local_90,format,power);
    PopItemWidth();
    SameLine(0.0,(pIVar1->Style).ItemInnerSpacing.x);
    if (v_min < v_max) {
      v_min_00 = ImMax<double>(v_min,*v_current_min);
      local_b8 = v_max;
    }
    else {
      v_min_00 = *v_current_min;
      local_b8 = 3.4028234663852886e+38;
    }
    local_c8 = format;
    if (format_max != (char *)0x0) {
      local_c8 = format_max;
    }
    bVar3 = DragDouble("##max",v_current_max,v_speed,v_min_00,local_b8,local_c8,power);
    label_local._7_1_ = bVar2 || bVar3;
    PopItemWidth();
    SameLine(0.0,(pIVar1->Style).ItemInnerSpacing.x);
    text_end = FindRenderedTextEnd(label,(char *)0x0);
    TextEx(label,text_end,0);
    EndGroup();
    PopID();
  }
  else {
    label_local._7_1_ = false;
  }
  return label_local._7_1_;
}

Assistant:

bool DragDoubleRange2(const char *label, double *v_current_min, double *v_current_max,
                      float v_speed, double v_min, double v_max, const char *format,
                      const char *format_max, float power) {
    ImGuiWindow *window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext &g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    bool value_changed =
        DragDouble("##min", v_current_min, v_speed, (v_min >= v_max) ? -FLT_MAX : v_min,
                   (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max), format, power);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);
    value_changed |=
        DragDouble("##max", v_current_max, v_speed,
                   (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min),
                   (v_min >= v_max) ? FLT_MAX : v_max, format_max ? format_max : format, power);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();
    return value_changed;
}